

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pg_functions.cpp
# Opt level: O1

char * duckdb_libpgquery::psprintf(char *fmt,...)

{
  char in_AL;
  uint uVar1;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buf [8192];
  undefined8 local_2108;
  void **local_2100;
  undefined1 *local_20f8;
  undefined1 local_20e8 [8];
  undefined8 local_20e0;
  undefined8 local_20d8;
  undefined8 local_20d0;
  undefined8 local_20c8;
  undefined8 local_20c0;
  undefined8 local_20b8;
  undefined8 local_20a8;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  char local_2038 [8200];
  
  if (in_AL != '\0') {
    local_20b8 = in_XMM0_Qa;
    local_20a8 = in_XMM1_Qa;
    local_2098 = in_XMM2_Qa;
    local_2088 = in_XMM3_Qa;
    local_2078 = in_XMM4_Qa;
    local_2068 = in_XMM5_Qa;
    local_2058 = in_XMM6_Qa;
    local_2048 = in_XMM7_Qa;
  }
  local_2108 = 0x3000000008;
  local_2100 = &args[0].overflow_arg_area;
  local_20f8 = local_20e8;
  local_20e0 = in_RSI;
  local_20d8 = in_RDX;
  local_20d0 = in_RCX;
  local_20c8 = in_R8;
  local_20c0 = in_R9;
  uVar1 = vsnprintf(local_2038,0x2000,fmt,&local_2108);
  if (uVar1 < 0x2000) {
    __s = pstrdup(local_2038);
  }
  else {
    __s = (char *)palloc((long)(int)uVar1);
    local_2108 = 0x3000000008;
    local_2100 = &args[0].overflow_arg_area;
    local_20f8 = local_20e8;
    vsnprintf(__s,(long)(int)uVar1,fmt,&local_2108);
  }
  return __s;
}

Assistant:

char *psprintf(const char *fmt, ...) {
	char buf[BUFSIZ];
	va_list args;
	size_t newlen;

	// attempt one: use stack buffer and determine length
	va_start(args, fmt);
	newlen = vsnprintf(buf, BUFSIZ, fmt, args);
	va_end(args);
	if (newlen < BUFSIZ) {
		return pstrdup(buf);
	}

	// attempt two, malloc
	auto mbuf = (char *)palloc(newlen);
	va_start(args, fmt);
	vsnprintf(mbuf, newlen, fmt, args);
	va_end(args);
	return mbuf;
}